

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

apx_error_t expand_data_elements_on_ports(apx_node_t *self,adt_ary_t *ports)

{
  int32_t iVar1;
  apx_error_t aVar2;
  apx_port_t *self_00;
  int s32Index;
  
  if (ports == (adt_ary_t *)0x0) {
    __assert_fail("(self != NULL) && (ports != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node.c"
                  ,0x180,"apx_error_t expand_data_elements_on_ports(apx_node_t *, adt_ary_t *)");
  }
  iVar1 = adt_ary_length(ports);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  s32Index = 0;
  while( true ) {
    if (iVar1 == s32Index) {
      return 0;
    }
    self_00 = (apx_port_t *)adt_ary_value(ports,s32Index);
    if (self_00 == (apx_port_t *)0x0) break;
    aVar2 = apx_port_flatten_data_element(self_00);
    s32Index = s32Index + 1;
    if (aVar2 != 0) {
      self->last_error_line = self_00->line_number;
      return aVar2;
    }
  }
  __assert_fail("port != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node.c"
                ,0x187,"apx_error_t expand_data_elements_on_ports(apx_node_t *, adt_ary_t *)");
}

Assistant:

static apx_error_t expand_data_elements_on_ports(apx_node_t* self, adt_ary_t* ports)
{
   int32_t num_ports;
   int32_t port_id;
   assert((self != NULL) && (ports != NULL));
   num_ports = adt_ary_length(ports);

   for (port_id = 0; port_id < num_ports; port_id++)
   {
      apx_error_t result;
      apx_port_t* port = (apx_port_t*)adt_ary_value(ports, port_id);
      assert(port != NULL);

      result = apx_port_flatten_data_element(port);
      if (result != APX_NO_ERROR)
      {
         self->last_error_line = port->line_number;
         return result;
      }
   }
   return APX_NO_ERROR;
}